

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  TEdge *e2;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference plVar4;
  reference plVar5;
  TEdge *pTVar6;
  OutPt *pOVar7;
  bool bVar8;
  bool local_1f9;
  OutPt *op2_3;
  OutPt *op2_2;
  TEdge *eNext_1;
  TEdge *ePrev;
  OutPt *op2_1;
  TEdge *eNextHorz_1;
  TEdge *eNext;
  IntPoint Pt_1;
  IntPoint Pt;
  OutPt *op2;
  TEdge *eNextHorz;
  IntPoint local_120;
  undefined1 local_110 [32];
  iterator local_f0;
  _List_const_iterator<long_long> local_e8;
  TEdge *local_e0;
  TEdge *e;
  OutPt *pOStack_d0;
  bool IsLastHorz;
  OutPt *op1;
  undefined1 local_c0 [24];
  list<long_long,_std::allocator<long_long>_> local_a8;
  iterator local_90;
  _List_const_iterator<long_long> local_88;
  _List_node_base *local_80;
  iterator local_78;
  _List_const_iterator<long_long> local_70;
  iterator local_68;
  _List_const_iterator<long_long> local_60;
  reverse_iterator<std::_List_const_iterator<long_long>_> local_58;
  const_reverse_iterator maxRit;
  const_iterator maxIt;
  TEdge *eMaxPair;
  TEdge *eLastHorz;
  long lStack_30;
  bool IsOpen;
  cInt horzRight;
  cInt horzLeft;
  TEdge *pTStack_18;
  Direction dir;
  TEdge *horzEdge_local;
  Clipper *this_local;
  
  bVar8 = horzEdge->WindDelta != 0;
  pTStack_18 = horzEdge;
  horzEdge_local = (TEdge *)this;
  GetHorzDirection(horzEdge,(Direction *)((long)&horzLeft + 4),&horzRight,&stack0xffffffffffffffd0);
  eMaxPair = pTStack_18;
  maxIt._M_node = (_List_node_base *)0x0;
  while( true ) {
    local_1f9 = false;
    if (eMaxPair->NextInLML != (TEdge *)0x0) {
      local_1f9 = IsHorizontal(eMaxPair->NextInLML);
    }
    if (local_1f9 == false) break;
    eMaxPair = eMaxPair->NextInLML;
  }
  if (eMaxPair->NextInLML == (TEdge *)0x0) {
    maxIt._M_node = (_List_node_base *)GetMaximaPair(eMaxPair);
  }
  std::_List_const_iterator<long_long>::_List_const_iterator(&maxRit.current);
  std::reverse_iterator<std::_List_const_iterator<long_long>_>::reverse_iterator(&local_58);
  sVar3 = std::__cxx11::list<long_long,_std::allocator<long_long>_>::size(&this->m_Maxima);
  if (sVar3 != 0) {
    if (horzLeft._4_4_ == dLeftToRight) {
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<long_long,_std::allocator<long_long>_>::begin(&this->m_Maxima);
      std::_List_const_iterator<long_long>::_List_const_iterator(&local_60,&local_68);
      maxRit.current._M_node =
           (_List_const_iterator<long_long>)(_List_const_iterator<long_long>)local_60._M_node;
      while( true ) {
        local_78._M_node =
             (_List_node_base *)
             std::__cxx11::list<long_long,_std::allocator<long_long>_>::end(&this->m_Maxima);
        std::_List_const_iterator<long_long>::_List_const_iterator(&local_70,&local_78);
        bVar1 = std::operator!=(&maxRit.current,&local_70);
        bVar2 = false;
        if (bVar1) {
          plVar4 = std::_List_const_iterator<long_long>::operator*(&maxRit.current);
          bVar2 = *plVar4 <= (pTStack_18->Bot).X;
        }
        if (!bVar2) break;
        local_80 = (_List_node_base *)
                   std::_List_const_iterator<long_long>::operator++(&maxRit.current,0);
      }
      local_90._M_node =
           (_List_node_base *)
           std::__cxx11::list<long_long,_std::allocator<long_long>_>::end(&this->m_Maxima);
      std::_List_const_iterator<long_long>::_List_const_iterator(&local_88,&local_90);
      bVar1 = std::operator!=(&maxRit.current,&local_88);
      bVar2 = false;
      if (bVar1) {
        plVar4 = std::_List_const_iterator<long_long>::operator*(&maxRit.current);
        bVar2 = (eMaxPair->Top).X <= *plVar4;
      }
      if (bVar2) {
        local_a8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
        super__List_node_base._M_prev =
             (_List_node_base *)
             std::__cxx11::list<long_long,_std::allocator<long_long>_>::end(&this->m_Maxima);
        std::_List_const_iterator<long_long>::_List_const_iterator
                  ((_List_const_iterator<long_long> *)
                   &local_a8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node
                    ._M_size,
                   (iterator *)
                   &local_a8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node
                    .super__List_node_base._M_prev);
        maxRit.current._M_node =
             (_List_const_iterator<long_long>)
             (_List_const_iterator<long_long>)
             local_a8.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
             _M_size;
      }
    }
    else {
      std::__cxx11::list<long_long,_std::allocator<long_long>_>::rbegin(&local_a8);
      std::reverse_iterator<std::_List_const_iterator<long_long>>::operator=
                ((reverse_iterator<std::_List_const_iterator<long_long>> *)&local_58,
                 (reverse_iterator<std::_List_iterator<long_long>_> *)&local_a8);
      while( true ) {
        std::__cxx11::list<long_long,_std::allocator<long_long>_>::rend
                  ((list<long_long,_std::allocator<long_long>_> *)(local_c0 + 0x10));
        bVar1 = std::operator!=(&local_58,
                                (reverse_iterator<std::_List_iterator<long_long>_> *)
                                (local_c0 + 0x10));
        bVar2 = false;
        if (bVar1) {
          plVar5 = std::reverse_iterator<std::_List_const_iterator<long_long>_>::operator*
                             (&local_58);
          bVar2 = (pTStack_18->Bot).X < *plVar5;
        }
        if (!bVar2) break;
        std::reverse_iterator<std::_List_const_iterator<long_long>_>::operator++
                  ((reverse_iterator<std::_List_const_iterator<long_long>_> *)(local_c0 + 8),
                   (int)&local_58);
      }
      std::__cxx11::list<long_long,_std::allocator<long_long>_>::rend
                ((list<long_long,_std::allocator<long_long>_> *)local_c0);
      bVar1 = std::operator!=(&local_58,
                              (reverse_iterator<std::_List_iterator<long_long>_> *)local_c0);
      bVar2 = false;
      if (bVar1) {
        plVar5 = std::reverse_iterator<std::_List_const_iterator<long_long>_>::operator*(&local_58);
        bVar2 = *plVar5 <= (eMaxPair->Top).X;
      }
      if (bVar2) {
        std::__cxx11::list<long_long,_std::allocator<long_long>_>::rend
                  ((list<long_long,_std::allocator<long_long>_> *)&op1);
        std::reverse_iterator<std::_List_const_iterator<long_long>>::operator=
                  ((reverse_iterator<std::_List_const_iterator<long_long>> *)&local_58,
                   (reverse_iterator<std::_List_iterator<long_long>_> *)&op1);
      }
    }
  }
  pOStack_d0 = (OutPt *)0x0;
  do {
    e._7_1_ = pTStack_18 == eMaxPair;
    local_e0 = GetNextInAEL(pTStack_18,horzLeft._4_4_);
    while (local_e0 != (TEdge *)0x0) {
      sVar3 = std::__cxx11::list<long_long,_std::allocator<long_long>_>::size(&this->m_Maxima);
      if (sVar3 != 0) {
        if (horzLeft._4_4_ == dLeftToRight) {
          while( true ) {
            local_f0._M_node =
                 (_List_node_base *)
                 std::__cxx11::list<long_long,_std::allocator<long_long>_>::end(&this->m_Maxima);
            std::_List_const_iterator<long_long>::_List_const_iterator(&local_e8,&local_f0);
            bVar1 = std::operator!=(&maxRit.current,&local_e8);
            bVar2 = false;
            if (bVar1) {
              plVar4 = std::_List_const_iterator<long_long>::operator*(&maxRit.current);
              bVar2 = *plVar4 < (local_e0->Curr).X;
            }
            pTVar6 = pTStack_18;
            if (!bVar2) break;
            if ((-1 < pTStack_18->OutIdx) && (bVar8)) {
              plVar4 = std::_List_const_iterator<long_long>::operator*(&maxRit.current);
              IntPoint::IntPoint((IntPoint *)(local_110 + 0x10),*plVar4,(pTStack_18->Bot).Y);
              AddOutPt(this,pTVar6,(IntPoint *)(local_110 + 0x10));
            }
            local_110._8_8_ = std::_List_const_iterator<long_long>::operator++(&maxRit.current,0);
          }
        }
        else {
          while( true ) {
            std::__cxx11::list<long_long,_std::allocator<long_long>_>::rend
                      ((list<long_long,_std::allocator<long_long>_> *)local_110);
            bVar1 = std::operator!=(&local_58,
                                    (reverse_iterator<std::_List_iterator<long_long>_> *)local_110);
            bVar2 = false;
            if (bVar1) {
              plVar5 = std::reverse_iterator<std::_List_const_iterator<long_long>_>::operator*
                                 (&local_58);
              bVar2 = (local_e0->Curr).X < *plVar5;
            }
            pTVar6 = pTStack_18;
            if (!bVar2) break;
            if ((-1 < pTStack_18->OutIdx) && (bVar8)) {
              plVar5 = std::reverse_iterator<std::_List_const_iterator<long_long>_>::operator*
                                 (&local_58);
              IntPoint::IntPoint(&local_120,*plVar5,(pTStack_18->Bot).Y);
              AddOutPt(this,pTVar6,&local_120);
            }
            std::reverse_iterator<std::_List_const_iterator<long_long>_>::operator++
                      ((reverse_iterator<std::_List_const_iterator<long_long>_> *)&eNextHorz,
                       (int)&local_58);
          }
        }
      }
      if ((((horzLeft._4_4_ == dLeftToRight) && (lStack_30 < (local_e0->Curr).X)) ||
          ((horzLeft._4_4_ == dRightToLeft && ((local_e0->Curr).X < horzRight)))) ||
         ((((local_e0->Curr).X == (pTStack_18->Top).X && (pTStack_18->NextInLML != (TEdge *)0x0)) &&
          (local_e0->Dx < pTStack_18->NextInLML->Dx)))) break;
      if ((-1 < pTStack_18->OutIdx) && (bVar8)) {
        pOStack_d0 = AddOutPt(this,pTStack_18,&local_e0->Curr);
        for (op2 = (OutPt *)this->m_SortedEdges; op2 != (OutPt *)0x0; op2 = *(OutPt **)(op2 + 3)) {
          if ((-1 < *(int *)((long)&op2[1].Prev + 4)) &&
             (bVar2 = HorzSegmentsOverlap((pTStack_18->Bot).X,(pTStack_18->Top).X,*(cInt *)op2,
                                          (cInt)op2->Prev), bVar2)) {
            pOVar7 = GetLastOutPt(this,(TEdge *)op2);
            AddJoin(this,pOVar7,pOStack_d0,*(IntPoint *)&op2->Prev);
          }
        }
        AddGhostJoin(this,pOStack_d0,pTStack_18->Bot);
      }
      if ((local_e0 == (TEdge *)maxIt._M_node) && ((e._7_1_ & 1) != 0)) {
        if (-1 < pTStack_18->OutIdx) {
          AddLocalMaxPoly(this,pTStack_18,(TEdge *)maxIt._M_node,&pTStack_18->Top);
        }
        ClipperBase::DeleteFromAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   pTStack_18);
        ClipperBase::DeleteFromAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   (TEdge *)maxIt._M_node);
        return;
      }
      if (horzLeft._4_4_ == dLeftToRight) {
        IntPoint::IntPoint((IntPoint *)&Pt_1.Y,(local_e0->Curr).X,(pTStack_18->Curr).Y);
        IntersectEdges(this,pTStack_18,local_e0,(IntPoint *)&Pt_1.Y);
      }
      else {
        IntPoint::IntPoint((IntPoint *)&eNext,(local_e0->Curr).X,(pTStack_18->Curr).Y);
        IntersectEdges(this,local_e0,pTStack_18,(IntPoint *)&eNext);
      }
      pTVar6 = GetNextInAEL(local_e0,horzLeft._4_4_);
      ClipperBase::SwapPositionsInAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 pTStack_18,local_e0);
      local_e0 = pTVar6;
    }
    if ((pTStack_18->NextInLML == (TEdge *)0x0) ||
       (bVar2 = IsHorizontal(pTStack_18->NextInLML), !bVar2)) {
      if ((-1 < pTStack_18->OutIdx) && (pOStack_d0 == (OutPt *)0x0)) {
        pOStack_d0 = GetLastOutPt(this,pTStack_18);
        for (op2_1 = (OutPt *)this->m_SortedEdges; op2_1 != (OutPt *)0x0;
            op2_1 = *(OutPt **)(op2_1 + 3)) {
          if ((-1 < *(int *)((long)&op2_1[1].Prev + 4)) &&
             (bVar8 = HorzSegmentsOverlap((pTStack_18->Bot).X,(pTStack_18->Top).X,*(cInt *)op2_1,
                                          (cInt)op2_1->Prev), bVar8)) {
            pOVar7 = GetLastOutPt(this,(TEdge *)op2_1);
            AddJoin(this,pOVar7,pOStack_d0,*(IntPoint *)&op2_1->Prev);
          }
        }
        AddGhostJoin(this,pOStack_d0,pTStack_18->Top);
      }
      if (pTStack_18->NextInLML == (TEdge *)0x0) {
        if (-1 < pTStack_18->OutIdx) {
          AddOutPt(this,pTStack_18,&pTStack_18->Top);
        }
        ClipperBase::DeleteFromAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   pTStack_18);
      }
      else if (pTStack_18->OutIdx < 0) {
        ClipperBase::UpdateEdgeIntoAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   &stack0xffffffffffffffe8);
      }
      else {
        pOStack_d0 = AddOutPt(this,pTStack_18,&pTStack_18->Top);
        ClipperBase::UpdateEdgeIntoAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   &stack0xffffffffffffffe8);
        if (pTStack_18->WindDelta != 0) {
          pTVar6 = pTStack_18->PrevInAEL;
          e2 = pTStack_18->NextInAEL;
          if ((((pTVar6 == (TEdge *)0x0) || ((pTVar6->Curr).X != (pTStack_18->Bot).X)) ||
              ((pTVar6->Curr).Y != (pTStack_18->Bot).Y)) ||
             (((pTVar6->WindDelta == 0 || (pTVar6->OutIdx < 0)) ||
              (((pTVar6->Curr).Y <= (pTVar6->Top).Y ||
               (bVar8 = SlopesEqual(pTStack_18,pTVar6,
                                    (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                                 [(long)&(this->m_GhostJoins).
                                                                                                                  
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                                 ] & 1)), !bVar8)))))) {
            if (((e2 != (TEdge *)0x0) && ((e2->Curr).X == (pTStack_18->Bot).X)) &&
               (((e2->Curr).Y == (pTStack_18->Bot).Y &&
                ((((e2->WindDelta != 0 && (-1 < e2->OutIdx)) && ((e2->Top).Y < (e2->Curr).Y)) &&
                 (bVar8 = SlopesEqual(pTStack_18,e2,
                                      (bool)((byte)(this->_vptr_Clipper[-3] + 8)
                                                   [(long)&(this->m_GhostJoins).
                                                                                                                      
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                                  ] & 1)), bVar8)))))) {
              pOVar7 = AddOutPt(this,e2,&pTStack_18->Bot);
              AddJoin(this,pOStack_d0,pOVar7,pTStack_18->Top);
            }
          }
          else {
            pOVar7 = AddOutPt(this,pTVar6,&pTStack_18->Bot);
            AddJoin(this,pOStack_d0,pOVar7,pTStack_18->Top);
          }
        }
      }
      return;
    }
    ClipperBase::UpdateEdgeIntoAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
               &stack0xffffffffffffffe8);
    if (-1 < pTStack_18->OutIdx) {
      AddOutPt(this,pTStack_18,&pTStack_18->Bot);
    }
    GetHorzDirection(pTStack_18,(Direction *)((long)&horzLeft + 4),&horzRight,
                     &stack0xffffffffffffffd0);
  } while( true );
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  cInt horzLeft, horzRight;
  bool IsOpen = (horzEdge->WindDelta == 0);

  GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  TEdge* eLastHorz = horzEdge, *eMaxPair = 0;
  while (eLastHorz->NextInLML && IsHorizontal(*eLastHorz->NextInLML)) 
    eLastHorz = eLastHorz->NextInLML;
  if (!eLastHorz->NextInLML)
    eMaxPair = GetMaximaPair(eLastHorz);

  MaximaList::const_iterator maxIt;
  MaximaList::const_reverse_iterator maxRit;
  if (m_Maxima.size() > 0)
  {
      //get the first maxima in range (X) ...
      if (dir == dLeftToRight)
      {
          maxIt = m_Maxima.begin();
          while (maxIt != m_Maxima.end() && *maxIt <= horzEdge->Bot.X) maxIt++;
          if (maxIt != m_Maxima.end() && *maxIt >= eLastHorz->Top.X)
              maxIt = m_Maxima.end();
      }
      else
      {
          maxRit = m_Maxima.rbegin();
          while (maxRit != m_Maxima.rend() && *maxRit > horzEdge->Bot.X) maxRit++;
          if (maxRit != m_Maxima.rend() && *maxRit <= eLastHorz->Top.X)
              maxRit = m_Maxima.rend();
      }
  }

  OutPt* op1 = 0;

  for (;;) //loop through consec. horizontal edges
  {
		  
    bool IsLastHorz = (horzEdge == eLastHorz);
    TEdge* e = GetNextInAEL(horzEdge, dir);
    while(e)
    {

        //this code block inserts extra coords into horizontal edges (in output
        //polygons) whereever maxima touch these horizontal edges. This helps
        //'simplifying' polygons (ie if the Simplify property is set).
        if (m_Maxima.size() > 0)
        {
            if (dir == dLeftToRight)
            {
                while (maxIt != m_Maxima.end() && *maxIt < e->Curr.X) 
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxIt, horzEdge->Bot.Y));
                  maxIt++;
                }
            }
            else
            {
                while (maxRit != m_Maxima.rend() && *maxRit > e->Curr.X)
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxRit, horzEdge->Bot.Y));
                  maxRit++;
                }
            }
        };

        if ((dir == dLeftToRight && e->Curr.X > horzRight) ||
			(dir == dRightToLeft && e->Curr.X < horzLeft)) break;

		//Also break if we've got to the end of an intermediate horizontal edge ...
		//nb: Smaller Dx's are to the right of larger Dx's ABOVE the horizontal.
		if (e->Curr.X == horzEdge->Top.X && horzEdge->NextInLML && 
			e->Dx < horzEdge->NextInLML->Dx) break;

    if (horzEdge->OutIdx >= 0 && !IsOpen)  //note: may be done multiple times
		{
#ifdef use_xyz
			if (dir == dLeftToRight) SetZ(e->Curr, *horzEdge, *e);
			else SetZ(e->Curr, *e, *horzEdge);
#endif      
			op1 = AddOutPt(horzEdge, e->Curr);
			TEdge* eNextHorz = m_SortedEdges;
			while (eNextHorz)
			{
				if (eNextHorz->OutIdx >= 0 &&
					HorzSegmentsOverlap(horzEdge->Bot.X,
					horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
				{
                    OutPt* op2 = GetLastOutPt(eNextHorz);
                    AddJoin(op2, op1, eNextHorz->Top);
				}
				eNextHorz = eNextHorz->NextInSEL;
			}
			AddGhostJoin(op1, horzEdge->Bot);
		}
		
		//OK, so far we're still in range of the horizontal Edge  but make sure
        //we're at the last of consec. horizontals when matching with eMaxPair
        if(e == eMaxPair && IsLastHorz)
        {
          if (horzEdge->OutIdx >= 0)
            AddLocalMaxPoly(horzEdge, eMaxPair, horzEdge->Top);
          DeleteFromAEL(horzEdge);
          DeleteFromAEL(eMaxPair);
          return;
        }
        
		if(dir == dLeftToRight)
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges(horzEdge, e, Pt);
        }
        else
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges( e, horzEdge, Pt);
        }
        TEdge* eNext = GetNextInAEL(e, dir);
        SwapPositionsInAEL( horzEdge, e );
        e = eNext;
    } //end while(e)

	//Break out of loop if HorzEdge.NextInLML is not also horizontal ...
	if (!horzEdge->NextInLML || !IsHorizontal(*horzEdge->NextInLML)) break;

	UpdateEdgeIntoAEL(horzEdge);
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Bot);
    GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  } //end for (;;)

  if (horzEdge->OutIdx >= 0 && !op1)
  {
      op1 = GetLastOutPt(horzEdge);
      TEdge* eNextHorz = m_SortedEdges;
      while (eNextHorz)
      {
          if (eNextHorz->OutIdx >= 0 &&
              HorzSegmentsOverlap(horzEdge->Bot.X,
              horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
          {
              OutPt* op2 = GetLastOutPt(eNextHorz);
              AddJoin(op2, op1, eNextHorz->Top);
          }
          eNextHorz = eNextHorz->NextInSEL;
      }
      AddGhostJoin(op1, horzEdge->Top);
  }

  if (horzEdge->NextInLML)
  {
    if(horzEdge->OutIdx >= 0)
    {
      op1 = AddOutPt( horzEdge, horzEdge->Top);
      UpdateEdgeIntoAEL(horzEdge);
      if (horzEdge->WindDelta == 0) return;
      //nb: HorzEdge is no longer horizontal here
      TEdge* ePrev = horzEdge->PrevInAEL;
      TEdge* eNext = horzEdge->NextInAEL;
      if (ePrev && ePrev->Curr.X == horzEdge->Bot.X &&
        ePrev->Curr.Y == horzEdge->Bot.Y && ePrev->WindDelta != 0 &&
        (ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(*horzEdge, *ePrev, m_UseFullRange)))
      {
        OutPt* op2 = AddOutPt(ePrev, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
      else if (eNext && eNext->Curr.X == horzEdge->Bot.X &&
        eNext->Curr.Y == horzEdge->Bot.Y && eNext->WindDelta != 0 &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(*horzEdge, *eNext, m_UseFullRange))
      {
        OutPt* op2 = AddOutPt(eNext, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
    }
    else
      UpdateEdgeIntoAEL(horzEdge); 
  }
  else
  {
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Top);
    DeleteFromAEL(horzEdge);
  }
}